

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeObjectiveFunction.cpp
# Opt level: O2

DynamicVector<double,_std::allocator<double>_> * __thiscall
OpenMD::FluctuatingChargeObjectiveFunction::setInitialCoords
          (DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,
          FluctuatingChargeObjectiveFunction *this)

{
  pointer ppAVar1;
  pointer pdVar2;
  Molecule *pMVar3;
  pointer ppAVar4;
  int iVar5;
  Atom *pAVar6;
  long lVar7;
  MoleculeIterator i;
  allocator_type local_29;
  MoleculeIterator local_28;
  
  local_28._M_node = (_Base_ptr)0x0;
  this->nFlucQ_ = 0;
  pMVar3 = SimInfo::beginMolecule(this->info_,&local_28);
  while (pMVar3 != (Molecule *)0x0) {
    ppAVar4 = (pMVar3->fluctuatingCharges_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppAVar1 = (pMVar3->fluctuatingCharges_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppAVar4 == ppAVar1) {
      pAVar6 = (Atom *)0x0;
    }
    else {
      pAVar6 = *ppAVar4;
    }
    iVar5 = this->nFlucQ_;
    while( true ) {
      iVar5 = iVar5 + 1;
      ppAVar4 = ppAVar4 + 1;
      if (pAVar6 == (Atom *)0x0) break;
      this->nFlucQ_ = iVar5;
      if (ppAVar4 == ppAVar1) {
        pAVar6 = (Atom *)0x0;
      }
      else {
        pAVar6 = *ppAVar4;
      }
    }
    pMVar3 = SimInfo::nextMolecule(this->info_,&local_28);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->data_,(long)this->nFlucQ_,&local_29);
  pMVar3 = SimInfo::beginMolecule(this->info_,&local_28);
  lVar7 = 0;
  while (pMVar3 != (Molecule *)0x0) {
    ppAVar4 = (pMVar3->fluctuatingCharges_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppAVar1 = (pMVar3->fluctuatingCharges_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppAVar4 == ppAVar1) {
      pAVar6 = (Atom *)0x0;
    }
    else {
      pAVar6 = *ppAVar4;
    }
    pdVar2 = (__return_storage_ptr__->data_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)(int)lVar7;
    while (ppAVar4 = ppAVar4 + 1, pAVar6 != (Atom *)0x0) {
      pdVar2[lVar7] =
           *(double *)
            (*(long *)((long)&(((pAVar6->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                              atomData).flucQPos.super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (pAVar6->super_StuntDouble).storage_) +
            (long)(pAVar6->super_StuntDouble).localIndex_ * 8);
      if (ppAVar4 == ppAVar1) {
        pAVar6 = (Atom *)0x0;
      }
      else {
        pAVar6 = *ppAVar4;
      }
      lVar7 = lVar7 + 1;
    }
    pMVar3 = SimInfo::nextMolecule(this->info_,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicVector<RealType>
      FluctuatingChargeObjectiveFunction::setInitialCoords() {
#ifdef IS_MPI
    MPI_Comm_size(MPI_COMM_WORLD, &nproc_);
    MPI_Comm_rank(MPI_COMM_WORLD, &myrank_);
    std::vector<int> flucqOnProc_(nproc_, 0);

    displacements_.clear();
    displacements_.resize(nproc_, 0);
#endif

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;

    nFlucQ_ = 0;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        nFlucQ_++;
      }
    }

#ifdef IS_MPI
    MPI_Allgather(&nFlucQ_, 1, MPI_INT, &flucqOnProc_[0], 1, MPI_INT,
                  MPI_COMM_WORLD);

    nFlucQ_ = 0;
    for (int iproc = 0; iproc < nproc_; iproc++) {
      nFlucQ_ += flucqOnProc_[iproc];
    }

    displacements_[0] = 0;
    for (int iproc = 1; iproc < nproc_; iproc++) {
      displacements_[iproc] =
          displacements_[iproc - 1] + flucqOnProc_[iproc - 1];
    }
#endif

    DynamicVector<RealType> initCoords(nFlucQ_);

    int index;
#ifdef IS_MPI
    index = displacements_[myrank_];
#else
    index = 0;
#endif

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        initCoords[index++] = atom->getFlucQPos();
      }
    }

#ifdef IS_MPI
    MPI_Allgatherv(MPI_IN_PLACE, 0, MPI_DATATYPE_NULL, &initCoords[0],
                   &flucqOnProc_[0], &displacements_[0], MPI_REALTYPE,
                   MPI_COMM_WORLD);
#endif

    return initCoords;
  }